

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O3

void __thiscall
libtorrent::i2p_stream::
read_line<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (i2p_stream *this,error_code *e,
          _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *h)

{
  pointer pcVar1;
  char *pcVar2;
  pointer pcVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  int iVar8;
  code *pcVar9;
  long lVar10;
  char *pcVar11;
  long *plVar12;
  string *psVar13;
  noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
  *in_R8;
  size_type __rlen;
  noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
  *pnVar14;
  long lVar15;
  string_view last;
  string_view last_00;
  string_view last_01;
  string_view last_02;
  string_view last_03;
  string_view last_04;
  error_code ec;
  error_code invalid_response;
  noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
  *local_130;
  char *local_128;
  transfer_all_t local_119;
  vector<char> *local_118;
  int local_110;
  char local_10c;
  error_category *local_108;
  error_code local_100;
  read_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:227:4),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>_>
  local_f0;
  string *local_a8;
  i2p_stream *local_a0;
  mutable_buffer local_98;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_88;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_68;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_48;
  
  bVar7 = aux::proxy_base::
          handle_error<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>&>
                    (&this->super_proxy_base,e,h);
  if (bVar7) {
    return;
  }
  local_118 = &this->m_buffer;
  pcVar1 = (this->m_buffer).super_vector<char,_std::allocator<char>_>.
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  lVar15 = (ulong)(uint)(*(int *)&(this->m_buffer).super_vector<char,_std::allocator<char>_>.
                                  super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (int)pcVar1) << 0x20;
  lVar10 = lVar15 + -0x100000000 >> 0x20;
  if (pcVar1[lVar10] != '\n') {
    ::std::vector<char,_std::allocator<char>_>::resize
              (&local_118->super_vector<char,_std::allocator<char>_>,lVar15 + 0x100000000 >> 0x20);
    local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.data_ =
         (this->m_buffer).super_vector<char,_std::allocator<char>_>.
         super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start +
         (lVar15 >> 0x20);
    local_f0.handler_.m_underlying_handler._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>)
         (h->_M_bound_args).
         super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
         super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl;
    local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.size_ = 1;
    local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.total_consumed_ = 0
    ;
    local_f0.start_ = 0;
    local_f0.handler_.m_underlying_handler._M_f = h->_M_f;
    local_f0.handler_.m_underlying_handler._8_8_ = *(undefined8 *)&h->field_0x8;
    local_100.val_ = 0;
    local_100.failed_ = false;
    local_100.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    local_f0.stream_ =
         (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
          *)this;
    local_f0.handler_.m_handler.this = this;
    boost::asio::detail::
    read_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:227:4),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>_>
    ::operator()(&local_f0,&local_100,0,1);
    return;
  }
  pcVar1[lVar10] = '\0';
  if (this->m_command == cmd_incoming) {
    pcVar11 = (this->m_buffer).super_vector<char,_std::allocator<char>_>.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start;
    pcVar2 = (char *)(this->m_dest)._M_string_length;
    strlen(pcVar11);
    ::std::__cxx11::string::_M_replace((ulong)&this->m_dest,0,pcVar2,(ulong)pcVar11);
    pcVar9 = (code *)h->_M_f;
    plVar12 = (long *)((long)&(((h->_M_bound_args).
                                super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>
                                .super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>.
                               _M_head_impl)->super_session_interface).super_session_logger.
                              _vptr_session_logger + *(long *)&h->field_0x8);
    if (((ulong)pcVar9 & 1) != 0) {
      pcVar9 = *(code **)(pcVar9 + *plVar12 + -1);
    }
    (*pcVar9)(plVar12,e);
    pcVar1 = (this->m_buffer).super_vector<char,_std::allocator<char>_>.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pcVar3 = (this->m_buffer).super_vector<char,_std::allocator<char>_>.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    (local_118->super_vector<char,_std::allocator<char>_>).
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (local_118->super_vector<char,_std::allocator<char>_>).
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (local_118->super_vector<char,_std::allocator<char>_>).
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pcVar1 == (pointer)0x0) {
      return;
    }
    operator_delete(pcVar1,(long)pcVar3 - (long)pcVar1);
    return;
  }
  local_100.cat_ = i2p_category();
  local_100.val_ = 1;
  local_100.failed_ = true;
  if (((local_100.cat_)->id_ != 0x8fafd21e25c5e09b) && ((local_100.cat_)->id_ != 0xb2ab117a257edf0d)
     ) {
    iVar8 = (*(local_100.cat_)->_vptr_error_category[6])(local_100.cat_,1);
    local_100.failed_ = SUB41(iVar8,0);
  }
  switch(this->m_state) {
  case read_hello_response:
    bVar7 = true;
    pcVar11 = "HELLO";
    local_130 = (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                 *)0x5;
    local_128 = "REPLY";
    pnVar14 = (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
               *)0x5;
    break;
  case read_connect_response:
  case read_accept_response:
    bVar7 = true;
    pcVar11 = "STREAM";
    local_130 = (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                 *)0x6;
    local_128 = "STATUS";
    pnVar14 = (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
               *)0x6;
    break;
  case read_session_create_response:
    pnVar14 = (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
               *)0x7;
    pcVar11 = "SESSION";
    local_130 = (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                 *)0x6;
    local_128 = "STATUS";
    goto LAB_002e8ba2;
  case read_name_lookup_response:
    pnVar14 = (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
               *)0x6;
    pcVar11 = "NAMING";
    local_130 = (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                 *)0x5;
    local_128 = "REPLY";
LAB_002e8ba2:
    bVar7 = true;
    break;
  default:
    local_128 = (char *)0x0;
    local_130 = (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                 *)0x0;
    pcVar11 = (char *)0x0;
    bVar7 = false;
    pnVar14 = (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
               *)0x0;
  }
  pcVar1 = (this->m_buffer).super_vector<char,_std::allocator<char>_>.
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  last._M_str = (char *)0x20;
  last._M_len = (size_t)pcVar1;
  aux::split_string((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     *)&local_f0,
                    (aux *)((this->m_buffer).super_vector<char,_std::allocator<char>_>.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish + ~(ulong)pcVar1),last,(char)in_R8);
  sVar6 = local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.
          total_consumed_;
  sVar5 = local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.size_
  ;
  if ((((!bVar7) || (pnVar14 != local_f0.stream_)) ||
      (iVar8 = bcmp(pcVar11,local_f0.buffers_.
                            super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.data_
                    ,(size_t)pnVar14), iVar8 != 0)) ||
     ((last_00._M_str = (char *)0x20, last_00._M_len = sVar6,
      aux::split_string((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         *)&local_f0,(aux *)sVar5,last_00,(char)in_R8),
      sVar6 = local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.
              total_consumed_,
      sVar5 = local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.
              size_, local_130 != local_f0.stream_ ||
      (iVar8 = bcmp(local_128,
                    local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.
                    buffer_.data_,(size_t)local_130), iVar8 != 0)))) {
LAB_002e8c50:
    aux::proxy_base::
    handle_error<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>&>
              (&this->super_proxy_base,&local_100,h);
    return;
  }
  last_01._M_str = (char *)0x3d;
  last_01._M_len = sVar6;
  aux::split_string((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     *)&local_f0,(aux *)sVar5,last_01,(char)in_R8);
  if (local_f0.stream_ ==
      (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
       *)0x0) {
    local_130._0_4_ = 0;
  }
  else {
    local_a8 = &this->m_name_lookup;
    local_130._0_4_ = 0;
    do {
      pvVar4 = local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.
               data_;
      pnVar14 = local_f0.stream_;
      if (*(char *)local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.
                   total_consumed_ == '\"') {
        if ((aux *)local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.
                   buffer_.size_ == (aux *)0x0) {
          ::std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     1,0);
        }
        last_02._M_len =
             (char *)(local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.
                      total_consumed_ + 1);
        last_02._M_str = (char *)0x22;
        aux::split_string((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                           *)&local_f0,
                          (aux *)(local_f0.buffers_.
                                  super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_
                                  .size_ + -1),last_02,(char)in_R8);
        if (local_f0.stream_ ==
            (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
             *)0x0) goto LAB_002e8c50;
        in_R8 = (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                 *)((long)&local_f0.stream_[-1].
                           super_noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                           .
                           super_basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                           .
                           super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                           .impl_.executor_.prop_fns_ + 7);
      }
      else {
        last_03._M_str = (char *)0x20;
        last_03._M_len =
             local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.
             total_consumed_;
        aux::split_string((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                           *)&local_f0,
                          (aux *)local_f0.buffers_.
                                 super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.
                                 size_,last_03,(char)in_R8);
        in_R8 = local_f0.stream_;
      }
      sVar6 = local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.
              total_consumed_;
      sVar5 = local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.
              size_;
      if (in_R8 == (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                    *)0x0) goto LAB_002e8c50;
      if (pnVar14 ==
          (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
           *)0x5) {
        if (*(char *)((long)pvVar4 + 4) == 'E' && *pvVar4 == 0x554c4156) {
          pcVar11 = (char *)(this->m_name_lookup)._M_string_length;
          psVar13 = local_a8;
LAB_002e8e0c:
          ::std::__cxx11::string::_M_replace
                    ((ulong)psVar13,0,pcVar11,
                     (ulong)local_f0.buffers_.
                            super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.data_
                    );
        }
      }
      else if (pnVar14 ==
               (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                *)0xb) {
        if (*(long *)((long)pvVar4 + 3) == 0x4e4f4954414e4954 && *pvVar4 == 0x54414e4954534544) {
          pcVar11 = (char *)(this->m_dest)._M_string_length;
          psVar13 = &this->m_dest;
          goto LAB_002e8e0c;
        }
      }
      else if ((pnVar14 ==
                (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                 *)0x6) && (*(short *)((long)pvVar4 + 4) == 0x544c && *pvVar4 == 0x55534552)) {
        in_R8 = (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                 *)((long)&in_R8[-1].
                           super_noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                           .
                           super_basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                           .
                           super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                           .impl_.executor_.prop_fns_ + 6);
        switch(in_R8) {
        case (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
              *)0x0:
          if (*local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.
               data_ != 0x4b4f) goto switchD_002e8d90_caseD_3;
          local_130._0_4_ = 0;
          break;
        default:
switchD_002e8d90_caseD_3:
          local_130._0_4_ = 9;
          break;
        case (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
              *)0x5:
          if (*(int *)((long)local_f0.buffers_.
                             super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.
                             data_ + 3) != 0x54554f45 ||
              *local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.
               data_ != 0x454d4954) goto switchD_002e8d90_caseD_3;
          local_130._0_4_ = 6;
          break;
        case (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
              *)0x7:
          if ((char)*(long *)((long)local_f0.buffers_.
                                    super_consuming_single_buffer<boost::asio::mutable_buffer>.
                                    buffer_.data_ + 8) != 'R' ||
              *local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.
               data_ != 0x4f5252455f503249) goto switchD_002e8d90_caseD_3;
          local_130._0_4_ = 3;
          break;
        case (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
              *)0x8:
          if ((short)*(long *)((long)local_f0.buffers_.
                                     super_consuming_single_buffer<boost::asio::mutable_buffer>.
                                     buffer_.data_ + 8) != 0x4449 ||
              *local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.
               data_ != 0x5f44494c41564e49) goto switchD_002e8d90_caseD_3;
          local_130._0_4_ = 5;
          break;
        case (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
              *)0x9:
          if (*(long *)((long)local_f0.buffers_.
                              super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.
                              data_ + 3) != 0x59454b5f44494c41 ||
              *local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.
               data_ != 0x5f44494c41564e49) goto switchD_002e8d90_caseD_3;
          local_130._0_4_ = 4;
          break;
        case (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
              *)0xb:
          if (*(long *)((long)local_f0.buffers_.
                              super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.
                              data_ + 5) == 0x444e554f465f544f &&
              *local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.
               data_ == 0x5f544f4e5f59454b) {
            local_130._0_4_ = 7;
          }
          else {
            if (*(long *)((long)local_f0.buffers_.
                                super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.
                                data_ + 5) != 0x44495f4445544143 ||
                *local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.
                 buffer_.data_ != 0x544143494c505544) goto switchD_002e8d90_caseD_3;
            local_130._0_4_ = 8;
          }
          break;
        case (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
              *)0xd:
          if (*(long *)((long)local_f0.buffers_.
                              super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.
                              data_ + 7) != 0x524545505f484341 ||
              *local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.
               data_ != 0x4145525f544e4143) goto switchD_002e8d90_caseD_3;
          local_130._0_4_ = 2;
        }
      }
      last_04._M_str = (char *)0x3d;
      last_04._M_len = sVar6;
      aux::split_string((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         *)&local_f0,(aux *)sVar5,last_04,(char)in_R8);
    } while (local_f0.stream_ !=
             (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
              *)0x0);
  }
  local_108 = i2p_category();
  local_110 = (int)local_130;
  if ((local_108->id_ == 0xb2ab117a257edf0d) || (local_108->id_ == 0x8fafd21e25c5e09b)) {
    local_10c = (int)local_130 != 0;
    if ((int)local_130 == 0) goto LAB_002e9009;
  }
  else {
    iVar8 = (*local_108->_vptr_error_category[6])(local_108);
    local_10c = (char)iVar8;
    if (local_10c == '\0') {
LAB_002e9009:
      switch(this->m_state) {
      case read_hello_response:
        switch(this->m_command) {
        case cmd_none:
        case cmd_name_lookup:
        case cmd_incoming:
          goto switchD_002e9028_caseD_1;
        case cmd_create_session:
          local_48._M_f = h->_M_f;
          local_48._8_8_ = *(undefined8 *)&h->field_0x8;
          local_48._M_bound_args.
          super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
          super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>)
               (h->_M_bound_args).
               super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
               super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl;
          send_session_create<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                    (this,&local_48);
          return;
        case cmd_connect:
          local_88._M_f = h->_M_f;
          local_88._8_8_ = *(undefined8 *)&h->field_0x8;
          local_88._M_bound_args.
          super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
          super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>)
               (h->_M_bound_args).
               super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
               super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl;
          send_connect<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                    (this,&local_88);
          return;
        case cmd_accept:
          local_68._M_f = h->_M_f;
          local_68._8_8_ = *(undefined8 *)&h->field_0x8;
          local_68._M_bound_args.
          super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
          super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>)
               (h->_M_bound_args).
               super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
               super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl;
          send_accept<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                    (this,&local_68);
          return;
        default:
          return;
        }
      case read_connect_response:
      case read_session_create_response:
      case read_name_lookup_response:
switchD_002e9028_caseD_1:
        pcVar9 = (code *)h->_M_f;
        plVar12 = (long *)((long)&(((h->_M_bound_args).
                                    super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>
                                    .super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>.
                                   _M_head_impl)->super_session_interface).super_session_logger.
                                  _vptr_session_logger + *(long *)&h->field_0x8);
        if (((ulong)pcVar9 & 1) != 0) {
          pcVar9 = *(code **)(pcVar9 + *plVar12 + -1);
        }
        break;
      case read_accept_response:
        this->m_command = cmd_incoming;
        ::std::vector<char,_std::allocator<char>_>::resize
                  (&local_118->super_vector<char,_std::allocator<char>_>,1);
        pcVar1 = (this->m_buffer).super_vector<char,_std::allocator<char>_>.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        local_98.size_ =
             (long)(this->m_buffer).super_vector<char,_std::allocator<char>_>.
                   super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                   _M_finish - (long)pcVar1;
        local_98.data_ = (pointer)0x0;
        if (local_98.size_ != 0) {
          local_98.data_ = pcVar1;
        }
        local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.total_consumed_
             = (size_t)(h->_M_bound_args).
                       super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>
                       .super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl;
        local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.data_ =
             (void *)h->_M_f;
        local_f0.buffers_.super_consuming_single_buffer<boost::asio::mutable_buffer>.buffer_.size_ =
             *(size_t *)&h->field_0x8;
        local_f0.stream_ =
             (noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
              *)this;
        local_a0 = this;
        boost::asio::detail::
        initiate_async_read_buffer_sequence<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>>
        ::operator()((initiate_async_read_buffer_sequence<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>>
                      *)&local_a0,
                     (wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:383:5),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
                      *)&local_f0,&local_98,&local_119);
        return;
      default:
        return;
      }
      (*pcVar9)(plVar12,&local_110);
      pcVar1 = (this->m_buffer).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pcVar3 = (this->m_buffer).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      (local_118->super_vector<char,_std::allocator<char>_>).
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      (local_118->super_vector<char,_std::allocator<char>_>).
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      (local_118->super_vector<char,_std::allocator<char>_>).
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (pcVar1 == (pointer)0x0) {
        return;
      }
      operator_delete(pcVar1,(long)pcVar3 - (long)pcVar1);
      return;
    }
  }
  pcVar9 = (code *)h->_M_f;
  plVar12 = (long *)((long)&(((h->_M_bound_args).
                              super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>
                              .super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>.
                             _M_head_impl)->super_session_interface).super_session_logger.
                            _vptr_session_logger + *(long *)&h->field_0x8);
  if (((ulong)pcVar9 & 1) != 0) {
    pcVar9 = *(code **)(pcVar9 + *plVar12 + -1);
  }
  (*pcVar9)(plVar12,&local_110);
  return;
}

Assistant:

void read_line(error_code const& e, Handler h)
	{
		TORRENT_ASSERT(m_magic == 0x1337);
		COMPLETE_ASYNC("i2p_stream::read_line");
		if (handle_error(e, h)) return;

		auto const read_pos = int(m_buffer.size());

		// look for \n which means end of the response
		if (m_buffer[read_pos - 1] != '\n')
		{
			ADD_OUTSTANDING_ASYNC("i2p_stream::read_line");
			// read another byte from the socket
			m_buffer.resize(read_pos + 1);
			async_read(m_sock, boost::asio::buffer(&m_buffer[read_pos], 1), aux::wrap_allocator(
			[this](error_code const& ec, std::size_t, Handler hn) {
				read_line(ec, std::move(hn));
			}, std::move(h)));
			return;
		}
		m_buffer[read_pos - 1] = 0;

		if (m_command == cmd_incoming)
		{
			// this is the line containing the destination
			// of the incoming connection in an accept call
			m_dest = &m_buffer[0];
			h(e);
			std::vector<char>().swap(m_buffer);
			return;
		}

		error_code invalid_response(i2p_error::parse_failed
			, i2p_category());

		string_view expect1;
		string_view expect2;

		switch (m_state)
		{
			case read_hello_response:
				expect1 = "HELLO"_sv;
				expect2 = "REPLY"_sv;
				break;
			case read_connect_response:
			case read_accept_response:
				expect1 = "STREAM"_sv;
				expect2 = "STATUS"_sv;
				break;
			case read_session_create_response:
				expect1 = "SESSION"_sv;
				expect2 = "STATUS"_sv;
				break;
			case read_name_lookup_response:
				expect1 = "NAMING"_sv;
				expect2 = "REPLY"_sv;
				break;
		}

		TORRENT_ASSERT(m_buffer[int(m_buffer.size()) - 1] == '\0');
		string_view remaining(m_buffer.data(), m_buffer.size() - 1);
		string_view token;

		std::tie(token, remaining) = aux::split_string(remaining, ' ');
		if (expect1.empty() || expect1 != token)
		{ handle_error(invalid_response, h); return; }

		std::tie(token, remaining) = aux::split_string(remaining, ' ');
		if (expect2.empty() || expect2 != token)
		{ handle_error(invalid_response, h); return; }

		int result = 0;

		for(;;)
		{
			string_view name;
			std::tie(name, remaining) = aux::split_string(remaining, '=');
			if (name.empty()) break;
			string_view value;
			if (remaining[0] == '"')
			{
				std::tie(value, remaining) = aux::split_string(remaining.substr(1), '"');
				if (value.empty()) { handle_error(invalid_response, h); return; }
				value.remove_suffix(1);
			}
			else
			{
				std::tie(value, remaining) = aux::split_string(remaining, ' ');
			}
			if (value.empty()) { handle_error(invalid_response, h); return; }

			if ("RESULT"_sv == name)
			{
				if ("OK"_sv == value)
					result = i2p_error::no_error;
				else if ("CANT_REACH_PEER"_sv == value)
					result = i2p_error::cant_reach_peer;
				else if ("I2P_ERROR"_sv == value)
					result = i2p_error::i2p_error;
				else if ("INVALID_KEY"_sv == value)
					result = i2p_error::invalid_key;
				else if ("INVALID_ID"_sv == value)
					result = i2p_error::invalid_id;
				else if ("TIMEOUT"_sv == value)
					result = i2p_error::timeout;
				else if ("KEY_NOT_FOUND"_sv == value)
					result = i2p_error::key_not_found;
				else if ("DUPLICATED_ID"_sv == value)
					result = i2p_error::duplicated_id;
				else
					result = i2p_error::num_errors; // unknown error
			}
			/*else if ("MESSAGE" == name)
			{
			}
			else if ("VERSION"_sv == name)
			{
			}*/
			else if ("VALUE"_sv == name)
			{
				m_name_lookup = value;
			}
			else if ("DESTINATION"_sv == name)
			{
				m_dest = value;
			}
		}

		error_code ec(result, i2p_category());
		if (ec)
		{
			std::forward<Handler>(h)(ec);
			return;
		}

		switch (m_state)
		{
		case read_hello_response:
			switch (m_command)
			{
				case cmd_create_session:
					send_session_create(std::move(h));
					break;
				case cmd_accept:
					send_accept(std::move(h));
					break;
				case cmd_connect:
					send_connect(std::move(h));
					break;
				case cmd_none:
				case cmd_name_lookup:
				case cmd_incoming:
					std::forward<Handler>(h)(ec);
					std::vector<char>().swap(m_buffer);
			}
			break;
		case read_connect_response:
		case read_session_create_response:
		case read_name_lookup_response:
			std::forward<Handler>(h)(ec);
			std::vector<char>().swap(m_buffer);
			break;
		case read_accept_response:
			// the SAM bridge is waiting for an incoming
			// connection.
			// wait for one more line containing
			// the destination of the remote peer
			m_command = cmd_incoming;
			m_buffer.resize(1);
			ADD_OUTSTANDING_ASYNC("i2p_stream::read_line");
			async_read(m_sock, boost::asio::buffer(m_buffer), aux::wrap_allocator(
				[this](error_code const& err, std::size_t, Handler hn) {
					read_line(err, std::move(hn));
				}, std::move(h)));
			break;
		}
	}